

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O2

bool __thiscall simdjson::dom::object::iterator::key_equals(iterator *this,string_view o)

{
  document *pdVar1;
  _Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> _Var2;
  int iVar3;
  ulong uVar4;
  
  pdVar1 = (this->tape).doc;
  _Var2.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (pdVar1->string_buf)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>;
  uVar4 = *(ulong *)((long)(pdVar1->tape)._M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                    + (this->tape).json_index * 8) & 0xffffffffffffff;
  if ((ulong)*(uint *)((long)_Var2.super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                      uVar4) == o._M_len) {
    iVar3 = bcmp(o._M_str,(void *)((long)_Var2.super__Head_base<0UL,_unsigned_char_*,_false>.
                                         _M_head_impl + uVar4 + 4),o._M_len);
    return iVar3 == 0;
  }
  return false;
}

Assistant:

inline bool object::iterator::key_equals(std::string_view o) const noexcept {
  // We use the fact that the key length can be computed quickly
  // without access to the string buffer.
  const uint32_t len = key_length();
  if(o.size() == len) {
    // We avoid construction of a temporary string_view instance.
    return (memcmp(o.data(), key_c_str(), len) == 0);
  }
  return false;
}